

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigSat.c
# Opt level: O0

int Fraig_NodeIsEquivalent
              (Fraig_Man_t *p,Fraig_Node_t *pOld,Fraig_Node_t *pNew,int nBTLimit,int nTimeLimit)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  abctime aVar4;
  int *piVar5;
  double dVar6;
  int fSwitch;
  int fVerbose;
  abctime clk;
  int fComp;
  int i;
  int RetValue1;
  int RetValue;
  int nTimeLimit_local;
  int nBTLimit_local;
  Fraig_Node_t *pNew_local;
  Fraig_Node_t *pOld_local;
  Fraig_Man_t *p_local;
  
  if (((ulong)pNew & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigSat.c"
                  ,0x136,
                  "int Fraig_NodeIsEquivalent(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *, int, int)"
                 );
  }
  if (((ulong)pOld & 1) == 0) {
    if (pNew == pOld) {
      __assert_fail("pNew != pOld",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigSat.c"
                    ,0x138,
                    "int Fraig_NodeIsEquivalent(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *, int, int)"
                   );
    }
    RetValue = nBTLimit;
    if ((0 < nBTLimit) &&
       (((*(uint *)&pOld->field_0x18 >> 9 & 1) != 0 || ((*(uint *)&pNew->field_0x18 >> 9 & 1) != 0))
       )) {
      p->nSatFails = p->nSatFails + 1;
      if (nBTLimit < 0xb) {
        return 0;
      }
      dVar6 = sqrt((double)nBTLimit);
      RetValue = (int)dVar6;
    }
    p->nSatCalls = p->nSatCalls + 1;
    if (p->pSat == (Msat_Solver_t *)0x0) {
      Fraig_ManCreateSolver(p);
    }
    for (clk._4_4_ = Msat_SolverReadVarNum(p->pSat); clk._4_4_ < p->vNodes->nSize;
        clk._4_4_ = clk._4_4_ + 1) {
      Msat_SolverAddVar(p->pSat,p->vNodes->pArray[clk._4_4_]->Level);
    }
    nMuxes = 0;
    aVar3 = Abc_Clock();
    Fraig_OrderVariables(p,pOld,pNew);
    aVar4 = Abc_Clock();
    p->timeTrav = (aVar4 - aVar3) + p->timeTrav;
    Fraig_SetActivity(p,pOld,pNew);
    iVar1 = Fraig_NodeComparePhase(pOld,pNew);
    Msat_SolverPrepare(p->pSat,p->vVarsInt);
    Msat_IntVecClear(p->vProj);
    Msat_IntVecPush(p->vProj,pOld->Num << 1);
    Msat_IntVecPush(p->vProj,pNew->Num * 2 + (uint)((iVar1 != 0 ^ 0xffU) & 1));
    aVar3 = Abc_Clock();
    iVar2 = Msat_SolverSolve(p->pSat,p->vProj,RetValue,nTimeLimit);
    aVar4 = Abc_Clock();
    p->timeSat = (aVar4 - aVar3) + p->timeSat;
    if (iVar2 == -1) {
      Msat_IntVecClear(p->vProj);
      Msat_IntVecPush(p->vProj,pOld->Num * 2 + 1);
      Msat_IntVecPush(p->vProj,pNew->Num * 2 + iVar1);
      iVar2 = Msat_SolverAddClause(p->pSat,p->vProj);
      if (iVar2 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigSat.c"
                      ,0x197,
                      "int Fraig_NodeIsEquivalent(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *, int, int)"
                     );
      }
      if (pOld == p->pConst1) {
        p_local._4_4_ = 1;
      }
      else {
        Msat_SolverPrepare(p->pSat,p->vVarsInt);
        Msat_IntVecClear(p->vProj);
        Msat_IntVecPush(p->vProj,pOld->Num * 2 + 1);
        Msat_IntVecPush(p->vProj,pNew->Num * 2 + iVar1);
        aVar3 = Abc_Clock();
        iVar2 = Msat_SolverSolve(p->pSat,p->vProj,RetValue,nTimeLimit);
        aVar4 = Abc_Clock();
        p->timeSat = (aVar4 - aVar3) + p->timeSat;
        if (iVar2 == -1) {
          Msat_IntVecClear(p->vProj);
          Msat_IntVecPush(p->vProj,pOld->Num << 1);
          Msat_IntVecPush(p->vProj,pNew->Num * 2 + (uint)((iVar1 != 0 ^ 0xffU) & 1));
          iVar1 = Msat_SolverAddClause(p->pSat,p->vProj);
          if (iVar1 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigSat.c"
                          ,0x1e4,
                          "int Fraig_NodeIsEquivalent(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *, int, int)"
                         );
          }
          p->nSatProof = p->nSatProof + 1;
          p_local._4_4_ = 1;
        }
        else if (iVar2 == 1) {
          piVar5 = Msat_SolverReadModelArray(p->pSat);
          Fraig_FeedBack(p,piVar5,p->vVarsInt,pOld,pNew);
          p->nSatCounter = p->nSatCounter + 1;
          p_local._4_4_ = 0;
        }
        else {
          aVar4 = Abc_Clock();
          p->time3 = (aVar4 - aVar3) + p->time3;
          *(uint *)&pOld->field_0x18 = *(uint *)&pOld->field_0x18 & 0xfffffdff | 0x200;
          *(uint *)&pNew->field_0x18 = *(uint *)&pNew->field_0x18 & 0xfffffdff | 0x200;
          p->nSatFailsReal = p->nSatFailsReal + 1;
          p_local._4_4_ = 0;
        }
      }
    }
    else if (iVar2 == 1) {
      piVar5 = Msat_SolverReadModelArray(p->pSat);
      Fraig_FeedBack(p,piVar5,p->vVarsInt,pOld,pNew);
      p->nSatCounter = p->nSatCounter + 1;
      p_local._4_4_ = 0;
    }
    else {
      aVar4 = Abc_Clock();
      p->time3 = (aVar4 - aVar3) + p->time3;
      if (pOld != p->pConst1) {
        *(uint *)&pOld->field_0x18 = *(uint *)&pOld->field_0x18 & 0xfffffdff | 0x200;
      }
      *(uint *)&pNew->field_0x18 = *(uint *)&pNew->field_0x18 & 0xfffffdff | 0x200;
      p->nSatFailsReal = p->nSatFailsReal + 1;
      p_local._4_4_ = 0;
    }
    return p_local._4_4_;
  }
  __assert_fail("!Fraig_IsComplement(pOld)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigSat.c"
                ,0x137,
                "int Fraig_NodeIsEquivalent(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *, int, int)"
               );
}

Assistant:

int Fraig_NodeIsEquivalent( Fraig_Man_t * p, Fraig_Node_t * pOld, Fraig_Node_t * pNew, int nBTLimit, int nTimeLimit )
{
    int RetValue, RetValue1, i, fComp;
    abctime clk;
    int fVerbose = 0;
    int fSwitch = 0;

    // make sure the nodes are not complemented
    assert( !Fraig_IsComplement(pNew) );
    assert( !Fraig_IsComplement(pOld) );
    assert( pNew != pOld );

    // if at least one of the nodes is a failed node, perform adjustments:
    // if the backtrack limit is small, simply skip this node
    // if the backtrack limit is > 10, take the quare root of the limit
    if ( nBTLimit > 0 && (pOld->fFailTfo || pNew->fFailTfo) )
    {
        p->nSatFails++;
//            return 0;
//        if ( nBTLimit > 10 )
//            nBTLimit /= 10;
        if ( nBTLimit <= 10 )
            return 0;
        nBTLimit = (int)sqrt((double)nBTLimit);
//        fSwitch = 1;
    }

    p->nSatCalls++;

    // make sure the solver is allocated and has enough variables
    if ( p->pSat == NULL )
        Fraig_ManCreateSolver( p );
    // make sure the SAT solver has enough variables
    for ( i = Msat_SolverReadVarNum(p->pSat); i < p->vNodes->nSize; i++ )
        Msat_SolverAddVar( p->pSat, p->vNodes->pArray[i]->Level );


 
/*
    {
        Fraig_Node_t * ppNodes[2] = { pOld, pNew };
        extern void Fraig_MappingShowNodes( Fraig_Man_t * pMan, Fraig_Node_t ** ppRoots, int nRoots, char * pFileName );
        Fraig_MappingShowNodes( p, ppNodes, 2, "temp_aig" );
    }
*/

    nMuxes = 0;


    // get the logic cone
clk = Abc_Clock();
//    Fraig_VarsStudy( p, pOld, pNew );
    Fraig_OrderVariables( p, pOld, pNew );
//    Fraig_PrepareCones( p, pOld, pNew );
p->timeTrav += Abc_Clock() - clk;

//    printf( "The number of MUXes detected = %d (%5.2f %% of logic).  ", nMuxes, 300.0*nMuxes/(p->vNodes->nSize - p->vInputs->nSize) );
//    ABC_PRT( "Time", Abc_Clock() - clk );

    if ( fVerbose )
        printf( "%d(%d) - ", Fraig_CountPis(p,p->vVarsInt), Msat_IntVecReadSize(p->vVarsInt) );


    // prepare variable activity
    Fraig_SetActivity( p, pOld, pNew );

    // get the complemented attribute
    fComp = Fraig_NodeComparePhase( pOld, pNew );
//Msat_SolverPrintClauses( p->pSat );

    ////////////////////////////////////////////
    // prepare the solver to run incrementally on these variables
//clk = Abc_Clock();
    Msat_SolverPrepare( p->pSat, p->vVarsInt );
//p->time3 += Abc_Clock() - clk;


    // solve under assumptions
    // A = 1; B = 0     OR     A = 1; B = 1 
    Msat_IntVecClear( p->vProj );
    Msat_IntVecPush( p->vProj, MSAT_VAR2LIT(pOld->Num, 0) );
    Msat_IntVecPush( p->vProj, MSAT_VAR2LIT(pNew->Num, !fComp) );

//Msat_SolverWriteDimacs( p->pSat, "temp_fraig.cnf" );

    // run the solver
clk = Abc_Clock();
    RetValue1 = Msat_SolverSolve( p->pSat, p->vProj, nBTLimit, nTimeLimit );
p->timeSat += Abc_Clock() - clk;

    if ( RetValue1 == MSAT_FALSE )
    {
//p->time1 += Abc_Clock() - clk;

if ( fVerbose )
{
//    printf( "unsat  %d  ", Msat_SolverReadBackTracks(p->pSat) );
//ABC_PRT( "time", Abc_Clock() - clk );
}

        // add the clause
        Msat_IntVecClear( p->vProj );
        Msat_IntVecPush( p->vProj, MSAT_VAR2LIT(pOld->Num, 1) );
        Msat_IntVecPush( p->vProj, MSAT_VAR2LIT(pNew->Num, fComp) );
        RetValue = Msat_SolverAddClause( p->pSat, p->vProj );
        assert( RetValue );
        // continue solving the other implication
    }
    else if ( RetValue1 == MSAT_TRUE )
    {
//p->time2 += Abc_Clock() - clk;

if ( fVerbose )
{
//    printf( "sat  %d  ", Msat_SolverReadBackTracks(p->pSat) );
//ABC_PRT( "time", Abc_Clock() - clk );
}

        // record the counter example
        Fraig_FeedBack( p, Msat_SolverReadModelArray(p->pSat), p->vVarsInt, pOld, pNew );

//        if ( pOld->fFailTfo || pNew->fFailTfo )
//            printf( "*" );
//        printf( "s(%d)", pNew->Level );
        if ( fSwitch )
             printf( "s(%d)", pNew->Level );
        p->nSatCounter++;
        return 0;
    }
    else // if ( RetValue1 == MSAT_UNKNOWN )
    {
p->time3 += Abc_Clock() - clk;

//        if ( pOld->fFailTfo || pNew->fFailTfo )
//            printf( "*" );
//        printf( "T(%d)", pNew->Level );

        // mark the node as the failed node
        if ( pOld != p->pConst1 ) 
            pOld->fFailTfo = 1;
        pNew->fFailTfo = 1;
//        p->nSatFails++;
        if ( fSwitch )
             printf( "T(%d)", pNew->Level );
        p->nSatFailsReal++;
        return 0;
    }

    // if the old node was constant 0, we already know the answer
    if ( pOld == p->pConst1 )
        return 1;

    ////////////////////////////////////////////
    // prepare the solver to run incrementally 
//clk = Abc_Clock();
    Msat_SolverPrepare( p->pSat, p->vVarsInt );
//p->time3 += Abc_Clock() - clk;
    // solve under assumptions
    // A = 0; B = 1     OR     A = 0; B = 0 
    Msat_IntVecClear( p->vProj );
    Msat_IntVecPush( p->vProj, MSAT_VAR2LIT(pOld->Num, 1) );
    Msat_IntVecPush( p->vProj, MSAT_VAR2LIT(pNew->Num, fComp) );
    // run the solver
clk = Abc_Clock();
    RetValue1 = Msat_SolverSolve( p->pSat, p->vProj, nBTLimit, nTimeLimit );
p->timeSat += Abc_Clock() - clk;

    if ( RetValue1 == MSAT_FALSE )
    {
//p->time1 += Abc_Clock() - clk;

if ( fVerbose )
{
//    printf( "unsat  %d  ", Msat_SolverReadBackTracks(p->pSat) );
//ABC_PRT( "time", Abc_Clock() - clk );
}

        // add the clause
        Msat_IntVecClear( p->vProj );
        Msat_IntVecPush( p->vProj, MSAT_VAR2LIT(pOld->Num, 0) );
        Msat_IntVecPush( p->vProj, MSAT_VAR2LIT(pNew->Num, !fComp) );
        RetValue = Msat_SolverAddClause( p->pSat, p->vProj );
        assert( RetValue );
        // continue solving the other implication
    }
    else if ( RetValue1 == MSAT_TRUE )
    {
//p->time2 += Abc_Clock() - clk;

if ( fVerbose )
{
//    printf( "sat  %d  ", Msat_SolverReadBackTracks(p->pSat) );
//ABC_PRT( "time", Abc_Clock() - clk );
}

        // record the counter example
        Fraig_FeedBack( p, Msat_SolverReadModelArray(p->pSat), p->vVarsInt, pOld, pNew );
        p->nSatCounter++;

//        if ( pOld->fFailTfo || pNew->fFailTfo )
//            printf( "*" );
//        printf( "s(%d)", pNew->Level );
        if ( fSwitch )
             printf( "s(%d)", pNew->Level );
        return 0;
    }
    else // if ( RetValue1 == MSAT_UNKNOWN )
    {
p->time3 += Abc_Clock() - clk;

//        if ( pOld->fFailTfo || pNew->fFailTfo )
//            printf( "*" );
//        printf( "T(%d)", pNew->Level );
        if ( fSwitch )
             printf( "T(%d)", pNew->Level );

        // mark the node as the failed node
        pOld->fFailTfo = 1;
        pNew->fFailTfo = 1;
//        p->nSatFails++;
        p->nSatFailsReal++;
        return 0;
    }

    // return SAT proof
    p->nSatProof++;

//    if ( pOld->fFailTfo || pNew->fFailTfo )
//        printf( "*" );
//    printf( "u(%d)", pNew->Level );

    if ( fSwitch )
         printf( "u(%d)", pNew->Level );

    return 1;
}